

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_small_width_height_test.cc
# Opt level: O0

void anon_unknown.dwarf_a24457::Encode1x1(aom_img_fmt fmt,int bitdepth,aom_codec_flags_t flags)

{
  bool bVar1;
  aom_codec_err_t aVar2;
  aom_codec_err_t aVar3;
  aom_codec_err_t aVar4;
  void *pvVar5;
  Message *message;
  int in_ESI;
  undefined4 in_EDI;
  ulong uVar6;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  aom_codec_ctx_t enc;
  AssertionResult gtest_ar_3;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  AssertionResult gtest_ar_2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> v_plane;
  AssertionResult gtest_ar_1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> u_plane;
  AssertionResult gtest_ar;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> y_plane;
  int uv_height;
  int y_height;
  int uv_stride;
  int y_stride;
  aom_image_t img;
  int kHeight;
  int kWidth;
  aom_codec_ctx_t *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  aom_codec_err_t in_stack_fffffffffffff914;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  char *in_stack_fffffffffffff928;
  int line;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  aom_image_t *in_stack_fffffffffffff938;
  Type type;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  Message *in_stack_fffffffffffff988;
  AssertHelper *in_stack_fffffffffffff990;
  AssertionResult local_618 [2];
  aom_codec_err_t local_5f8;
  undefined4 local_5f4;
  AssertionResult local_5f0 [2];
  aom_codec_err_t local_5d0;
  undefined4 local_5cc;
  AssertionResult local_5c8 [2];
  aom_codec_err_t local_5a8;
  undefined4 local_5a4;
  AssertionResult local_5a0 [2];
  aom_codec_err_t local_580;
  undefined4 local_57c;
  AssertionResult local_578;
  aom_codec_ctx_t local_568;
  aom_codec_err_t local_520;
  undefined4 local_51c;
  AssertionResult local_518;
  undefined4 local_4fc;
  undefined4 local_4f8;
  aom_codec_iface_t *local_180;
  undefined8 local_168;
  AssertionResult local_160 [2];
  undefined8 local_138;
  AssertionResult local_130;
  uint local_114;
  undefined8 local_f0;
  AssertionResult local_e8;
  int local_d0;
  int local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0 [7];
  undefined4 local_a4;
  undefined4 local_a0;
  int local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_88;
  undefined4 local_84;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_50;
  undefined4 local_18;
  undefined4 local_14;
  int local_8;
  undefined4 local_4;
  
  local_14 = 1;
  local_18 = 1;
  local_8 = in_ESI;
  local_4 = in_EDI;
  memset(local_c0,0,0xa8);
  local_c0[0] = local_4;
  local_9c = local_8;
  local_a4 = 1;
  local_a0 = 1;
  local_98 = 1;
  local_94 = 1;
  local_88 = 1;
  local_84 = 1;
  local_50 = 0xc;
  local_c4 = 1;
  local_c8 = 1;
  local_cc = 1;
  local_d0 = 1;
  if (8 < local_8) {
    local_cc = 2;
    local_d0 = 2;
  }
  local_68 = 1;
  local_60 = 1;
  local_64 = 1;
  uVar6 = (ulong)local_cc;
  pvVar5 = operator_new__(uVar6);
  memset(pvVar5,0,uVar6);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
             (uchar *)in_stack_fffffffffffff908);
  local_f0 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            (in_stack_fffffffffffff928,
             (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_fffffffffffff918,
             (void **)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    testing::AssertionResult::failure_message((AssertionResult *)0x811d17);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
               (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
               (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::Message::~Message((Message *)0x811d7a);
  }
  local_114 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x811e01);
  if (local_114 == 0) {
    uVar6 = (ulong)local_d0;
    if ((long)uVar6 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar6);
    memset(pvVar5,0,uVar6);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (uchar *)in_stack_fffffffffffff908);
    local_138 = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              (in_stack_fffffffffffff928,
               (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               in_stack_fffffffffffff918,
               (void **)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      in_stack_fffffffffffff990 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x811f0b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                 (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::Message::~Message((Message *)0x811f6e);
    }
    local_114 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x811ff5);
    if (local_114 == 0) {
      uVar6 = (ulong)local_d0;
      if ((long)uVar6 < 0) {
        uVar6 = 0xffffffffffffffff;
      }
      message = (Message *)operator_new__(uVar6);
      memset(message,0,uVar6);
      std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
      unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 (uchar *)in_stack_fffffffffffff908);
      local_168 = 0;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
                (in_stack_fffffffffffff928,
                 (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffff918,
                 (void **)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
        testing::AssertionResult::failure_message((AssertionResult *)0x8120f3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        testing::Message::~Message((Message *)0x812150);
      }
      local_114 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8121d7);
      if (local_114 == 0) {
        local_80 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                             ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        local_78 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                             ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        local_70 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                             ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        local_180 = aom_codec_av1_cx();
        local_51c = 0;
        local_520 = aom_codec_enc_config_default
                              ((aom_codec_iface_t *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               in_stack_fffffffffffff918,in_stack_fffffffffffff914);
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff928,
                   (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   &in_stack_fffffffffffff918->g_usage,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910))
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
          testing::AssertionResult::failure_message((AssertionResult *)0x8122e6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                     (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          testing::Message::~Message((Message *)0x812343);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8123b4);
        local_4fc = 1;
        local_4f8 = 1;
        local_57c = 0;
        local_580 = aom_codec_enc_init_ver
                              ((aom_codec_ctx_t *)
                               CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                               (aom_codec_iface_t *)in_stack_fffffffffffff938,
                               (aom_codec_enc_cfg_t *)
                               CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                               (aom_codec_flags_t)in_stack_fffffffffffff928,
                               in_stack_fffffffffffff924);
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff928,
                   (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   &in_stack_fffffffffffff918->g_usage,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910))
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_578);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
          testing::AssertionResult::failure_message((AssertionResult *)0x812484);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                     (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          testing::Message::~Message((Message *)0x8124e1);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x812552);
        local_5a4 = 0;
        aVar2 = aom_codec_control(&local_568,0xd,5);
        local_5a8 = aVar2;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff928,
                   (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   &in_stack_fffffffffffff918->g_usage,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910))
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a0);
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT44(aVar2,in_stack_fffffffffffff940));
          in_stack_fffffffffffff938 =
               (aom_image_t *)testing::AssertionResult::failure_message((AssertionResult *)0x8125fa)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffff940),
                     (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          testing::Message::~Message((Message *)0x812657);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8126c8);
        local_5cc = 0;
        aVar3 = aom_codec_encode((aom_codec_ctx_t *)CONCAT44(aVar2,in_stack_fffffffffffff940),
                                 in_stack_fffffffffffff938,
                                 CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                                 (unsigned_long)in_stack_fffffffffffff928,
                                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
        local_5d0 = aVar3;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff928,
                   (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   &in_stack_fffffffffffff918->g_usage,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910))
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT44(aVar2,in_stack_fffffffffffff940));
          in_stack_fffffffffffff928 =
               testing::AssertionResult::failure_message((AssertionResult *)0x812779);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffff940),
                     (Type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                     (char *)CONCAT44(aVar3,in_stack_fffffffffffff930),
                     (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          testing::Message::~Message((Message *)0x8127d6);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x812847);
        local_5f4 = 0;
        aVar4 = aom_codec_encode((aom_codec_ctx_t *)CONCAT44(aVar2,in_stack_fffffffffffff940),
                                 in_stack_fffffffffffff938,CONCAT44(aVar3,in_stack_fffffffffffff930)
                                 ,(unsigned_long)in_stack_fffffffffffff928,
                                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
        type = (Type)((ulong)in_stack_fffffffffffff938 >> 0x20);
        local_5f8 = aVar4;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff928,(char *)CONCAT44(aVar4,in_stack_fffffffffffff920),
                   &in_stack_fffffffffffff918->g_usage,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910))
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f0);
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT44(aVar2,in_stack_fffffffffffff940));
          in_stack_fffffffffffff918 =
               (aom_codec_enc_cfg_t *)
               testing::AssertionResult::failure_message((AssertionResult *)0x8128f1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffff940),type,
                     (char *)CONCAT44(aVar3,in_stack_fffffffffffff930),
                     (int)((ulong)in_stack_fffffffffffff928 >> 0x20),
                     (char *)CONCAT44(aVar4,in_stack_fffffffffffff920));
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          testing::Message::~Message((Message *)0x81294e);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8129bc);
        in_stack_fffffffffffff914 = aom_codec_destroy(in_stack_fffffffffffff908);
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffff928,(char *)CONCAT44(aVar4,in_stack_fffffffffffff920),
                   &in_stack_fffffffffffff918->g_usage,
                   (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910))
        ;
        line = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_618);
        if (!bVar1) {
          testing::Message::Message((Message *)CONCAT44(aVar2,in_stack_fffffffffffff940));
          testing::AssertionResult::failure_message((AssertionResult *)0x812a58);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffff940),type,
                     (char *)CONCAT44(aVar3,in_stack_fffffffffffff930),line,
                     (char *)CONCAT44(aVar4,in_stack_fffffffffffff920));
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffff990,message);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
          testing::Message::~Message((Message *)0x812ab3);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x812b21);
        local_114 = 0;
      }
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  return;
}

Assistant:

void Encode1x1(aom_img_fmt fmt, int bitdepth, aom_codec_flags_t flags) {
  constexpr int kWidth = 1;
  constexpr int kHeight = 1;

  // This test cannot use aom_img_alloc() or aom_img_wrap() because they call
  // align_image_dimension() to align img.w and img.h to the next even number
  // (2). In this test it is important to set img.w and img.h to 1. Therefore we
  // set up img manually.
  aom_image_t img;
  memset(&img, 0, sizeof(img));
  img.fmt = fmt;
  img.bit_depth = bitdepth;
  img.w = kWidth;
  img.h = kHeight;
  img.d_w = kWidth;
  img.d_h = kHeight;
  img.x_chroma_shift = 1;
  img.y_chroma_shift = 1;
  img.bps = 12;
  const int y_stride = kWidth;
  const int uv_stride = (kWidth + 1) >> 1;
  int y_height = kHeight;
  int uv_height = (kHeight + 1) >> 1;
  if (bitdepth > 8) {
    y_height <<= 1;
    uv_height <<= 1;
  }
  img.stride[AOM_PLANE_Y] = y_stride;
  img.stride[AOM_PLANE_U] = img.stride[AOM_PLANE_V] = uv_stride;
  std::unique_ptr<unsigned char[]> y_plane(
      new unsigned char[y_height * y_stride]());
  ASSERT_NE(y_plane, nullptr);
  std::unique_ptr<unsigned char[]> u_plane(
      new unsigned char[uv_height * uv_stride]());
  ASSERT_NE(u_plane, nullptr);
  std::unique_ptr<unsigned char[]> v_plane(
      new unsigned char[uv_height * uv_stride]());
  ASSERT_NE(v_plane, nullptr);
  img.planes[AOM_PLANE_Y] = y_plane.get();
  img.planes[AOM_PLANE_U] = u_plane.get();
  img.planes[AOM_PLANE_V] = v_plane.get();

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, kUsage));
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, flags));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 5));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}